

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

AnyCellmlElementPtr __thiscall libcellml::Annotator::item(Annotator *this,string *id,size_t index)

{
  LoggerImpl *pLVar1;
  bool bVar2;
  AnnotatorImpl *pAVar3;
  size_t in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  AnyCellmlElementPtr AVar5;
  vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
  local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  pAVar3 = (AnnotatorImpl *)Logger::pFunc((Logger *)id);
  AnnotatorImpl::update(pAVar3);
  pAVar3 = (AnnotatorImpl *)Logger::pFunc((Logger *)id);
  bVar2 = AnnotatorImpl::exists(pAVar3,(string *)index,in_RCX,false);
  if (bVar2) {
    items(&local_48,(Annotator *)id,(string *)index);
    (this->super_Logger)._vptr_Logger =
         (_func_int **)
         local_48.
         super__Vector_base<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
         ._M_impl.super__Vector_impl_data._M_start[in_RCX].
         super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_Logger).mPimpl = (LoggerImpl *)0x0;
    pLVar1 = (LoggerImpl *)
             local_48.
             super__Vector_base<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
             ._M_impl.super__Vector_impl_data._M_start[in_RCX].
             super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    local_48.
    super__Vector_base<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
    ._M_impl.super__Vector_impl_data._M_start[in_RCX].
    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_Logger).mPimpl = pLVar1;
    local_48.
    super__Vector_base<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
    ._M_impl.super__Vector_impl_data._M_start[in_RCX].
    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::
    vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
    ::~vector(&local_48);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    AVar5 = AnyCellmlElement::AnyCellmlElementImpl::create();
    _Var4 = AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnyCellmlElementPtr)
         AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnyCellmlElementPtr Annotator::item(const std::string &id, size_t index)
{
    pFunc()->update();
    return pFunc()->exists(id, index) ? std::move(items(id)[index]) : AnyCellmlElement::AnyCellmlElementImpl::create();
}